

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opt-utils.h
# Opt level: O0

void wasm::OptUtils::addUsefulPassesAfterInlining(PassRunner *runner)

{
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70;
  allocator<char> local_31;
  string local_30;
  PassRunner *local_10;
  PassRunner *runner_local;
  
  local_10 = runner;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"precompute-propagate",&local_31);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  PassRunner::add(runner,&local_30,&local_70);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_70);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  PassRunner::addDefaultFunctionOptimizationPasses(local_10);
  return;
}

Assistant:

inline void addUsefulPassesAfterInlining(PassRunner& runner) {
  // Propagating constants makes a lot of sense after inlining, as new constants
  // may have arrived.
  runner.add("precompute-propagate");
  // Do all the usual stuff.
  runner.addDefaultFunctionOptimizationPasses();
}